

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<unsigned_long,bool>
          (BaseAppender *this,Vector *col,unsigned_long input)

{
  bool bVar1;
  
  bVar1 = Cast::Operation<unsigned_long,bool>(input);
  col->data[(this->chunk).count] = bVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}